

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecuteProcessCommand.cxx
# Opt level: O1

void cmExecuteProcessCommandFixText
               (vector<char,_std::allocator<char>_> *output,bool strip_trailing_whitespace)

{
  pointer *ppcVar1;
  char cVar2;
  iterator __position;
  uint uVar3;
  int iVar4;
  ulong in_RAX;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  pointer pcVar8;
  undefined8 uStack_28;
  
  pcVar8 = (output->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  uVar6 = (long)(output->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pcVar8;
  if (uVar6 == 0) {
    uVar7 = 0;
  }
  else {
    uVar5 = 0;
    uVar3 = 1;
    uVar7 = 0;
    do {
      cVar2 = pcVar8[uVar5];
      uVar5 = (ulong)uVar3;
      if ((cVar2 != '\0') && (((cVar2 != '\r' || (uVar6 <= uVar5)) || (pcVar8[uVar5] != '\n')))) {
        pcVar8[uVar7] = cVar2;
        uVar7 = (ulong)((int)uVar7 + 1);
      }
      pcVar8 = (output->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = (long)(output->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pcVar8;
      uVar3 = uVar3 + 1;
    } while (uVar5 < uVar6);
  }
  uStack_28 = in_RAX;
  if (strip_trailing_whitespace && (int)uVar7 != 0) {
    do {
      cVar2 = pcVar8[uVar7 - 1];
      iVar4 = isspace((int)cVar2);
      if (((iVar4 == 0) && (cVar2 != '\r')) && (cVar2 != '\n')) goto LAB_003c4653;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
    uVar7 = 0;
  }
LAB_003c4653:
  std::vector<char,_std::allocator<char>_>::resize(output,uVar7 & 0xffffffff);
  uStack_28 = uStack_28 & 0xffffffffffffff;
  __position._M_current =
       (output->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (__position._M_current ==
      (output->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
              (output,__position,(char *)((long)&uStack_28 + 7));
  }
  else {
    *__position._M_current = '\0';
    ppcVar1 = &(output->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppcVar1 = *ppcVar1 + 1;
  }
  return;
}

Assistant:

void cmExecuteProcessCommandFixText(std::vector<char>& output,
                                    bool strip_trailing_whitespace)
{
  // Remove \0 characters and the \r part of \r\n pairs.
  unsigned int in_index = 0;
  unsigned int out_index = 0;
  while (in_index < output.size()) {
    char c = output[in_index++];
    if ((c != '\r' ||
         !(in_index < output.size() && output[in_index] == '\n')) &&
        c != '\0') {
      output[out_index++] = c;
    }
  }

  // Remove trailing whitespace if requested.
  if (strip_trailing_whitespace) {
    while (out_index > 0 &&
           cmExecuteProcessCommandIsWhitespace(output[out_index - 1])) {
      --out_index;
    }
  }

  // Shrink the vector to the size needed.
  output.resize(out_index);

  // Put a terminator on the text string.
  output.push_back('\0');
}